

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d4c.cc
# Opt level: O0

void sptk::world::anon_unknown_1::GetStaticCentroid
               (double *x,int x_length,int fs,double current_f0,int fft_size,double current_position
               ,ForwardRealFFT *forward_real_fft,double *static_centroid,RandnState *randn_state)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  void *pvVar4;
  void *pvVar5;
  int in_ECX;
  undefined8 in_R8;
  double *in_R9;
  double in_XMM1_Qa;
  int i;
  double *centroid2;
  double *centroid1;
  double *in_stack_000000c0;
  ForwardRealFFT *in_stack_000000c8;
  double in_stack_000000d0;
  int in_stack_000000dc;
  double in_stack_000000e0;
  int in_stack_000000e8;
  int in_stack_000000ec;
  double *in_stack_000000f0;
  RandnState *in_stack_00000100;
  int local_4c;
  undefined4 in_stack_ffffffffffffffe0;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(in_ECX / 2 + 1);
  uVar3 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pvVar4 = operator_new__(uVar3);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)(in_ECX / 2 + 1);
  uVar3 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pvVar5 = operator_new__(uVar3);
  GetCentroid(in_stack_000000f0,in_stack_000000ec,in_stack_000000e8,in_stack_000000e0,
              in_stack_000000dc,in_stack_000000d0,in_stack_000000c8,in_stack_000000c0,
              in_stack_00000100);
  GetCentroid(in_stack_000000f0,in_stack_000000ec,in_stack_000000e8,in_stack_000000e0,
              in_stack_000000dc,in_stack_000000d0,in_stack_000000c8,in_stack_000000c0,
              in_stack_00000100);
  for (local_4c = 0; local_4c <= in_ECX / 2; local_4c = local_4c + 1) {
    in_R9[local_4c] =
         *(double *)((long)pvVar4 + (long)local_4c * 8) +
         *(double *)((long)pvVar5 + (long)local_4c * 8);
  }
  DCCorrection((double *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),in_XMM1_Qa,
               (int)((ulong)in_R8 >> 0x20),(int)in_R8,in_R9);
  if (pvVar4 != (void *)0x0) {
    operator_delete__(pvVar4);
  }
  if (pvVar5 != (void *)0x0) {
    operator_delete__(pvVar5);
  }
  return;
}

Assistant:

static void GetStaticCentroid(const double *x, int x_length, int fs,
    double current_f0, int fft_size, double current_position,
    const ForwardRealFFT *forward_real_fft, double *static_centroid,
    RandnState *randn_state) {
  double *centroid1 = new double[fft_size / 2 + 1];
  double *centroid2 = new double[fft_size / 2 + 1];

  GetCentroid(x, x_length, fs, current_f0, fft_size,
      current_position - 0.25 / current_f0, forward_real_fft, centroid1,
      randn_state);
  GetCentroid(x, x_length, fs, current_f0, fft_size,
      current_position + 0.25 / current_f0, forward_real_fft, centroid2,
      randn_state);

  for (int i = 0; i <= fft_size / 2; ++i)
    static_centroid[i] = centroid1[i] + centroid2[i];

  DCCorrection(static_centroid, current_f0, fs, fft_size, static_centroid);
  delete[] centroid1;
  delete[] centroid2;
}